

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O2

longdouble * __thiscall
TPZMatRed<long_double,_TPZFMatrix<long_double>_>::s
          (TPZMatRed<long_double,_TPZFMatrix<long_double>_> *this,int64_t r,int64_t c)

{
  TPZMatrix<long_double> *pTVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  longdouble *plVar4;
  long col;
  long row;
  TPZFMatrix<long_double> *this_00;
  
  lVar3 = this->fDim0;
  col = c;
  if (r < lVar3) {
    iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x10])(this);
    if (c < r && iVar2 != 0) {
      col = r;
      r = c;
    }
    lVar3 = this->fDim0;
  }
  if (col < lVar3 && r < lVar3) {
    pTVar1 = ((this->fK00).fRef)->fPointer;
    iVar2 = (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])(pTVar1,r,col);
    return (longdouble *)CONCAT44(extraout_var,iVar2);
  }
  row = r - lVar3;
  if (r < lVar3) {
    if (lVar3 <= col) {
      this_00 = &this->fK01;
      col = col - lVar3;
      row = r;
      goto LAB_00db286a;
    }
  }
  else if (col < lVar3) {
    this_00 = &this->fK10;
    goto LAB_00db286a;
  }
  this_00 = &this->fK11;
  col = col - lVar3;
LAB_00db286a:
  plVar4 = TPZFMatrix<long_double>::operator()(this_00,row,col);
  return plVar4;
}

Assistant:

TVar& TPZMatRed<TVar,TSideMatrix>::s(const int64_t r,const int64_t c ) {
	int64_t row(r),col(c);
	
	if (r < fDim0 && IsSymmetric() && row > col ) Swap( &row, &col );
	if (row<fDim0 &&  col<fDim0)  return ( fK00->s(row,col) );
	if (row<fDim0 &&  col>=fDim0)  return ( (TVar &)fK01.s(row,col-fDim0) );
	if (row>=fDim0 &&  col<fDim0)  return ( (TVar &)(fK10.s(row-fDim0,col)) );
	return ((TVar &)(fK11.s(row-fDim0,col-fDim0)) );
	
}